

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2protocolhandler.cpp
# Opt level: O1

QHttp2Stream * __thiscall
QHttp2ProtocolHandler::createNewStream
          (QHttp2ProtocolHandler *this,HttpMessagePair *message,bool uploadDone)

{
  QHttpNetworkReply *this_00;
  int *piVar1;
  QDebug this_01;
  QHttp2Stream *stream;
  QLoggingCategory *pQVar2;
  QNonContiguousByteDevice *pQVar3;
  undefined4 *puVar4;
  undefined8 uVar5;
  char extraout_DL;
  int iVar6;
  anon_unknown_dwarf_72dc2c *this_02;
  long in_FS_OFFSET;
  QByteArrayView QVar7;
  QAnyStringView QVar8;
  Connection local_b0;
  int local_a4;
  QDebug local_a0;
  int local_98;
  QChar local_90;
  QMetaMethodReturnArgument local_88;
  char *local_70;
  QDebug local_68;
  QDebug local_60;
  QUrl streamKey;
  QObject *copy;
  ImplFn local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_02 = (anon_unknown_dwarf_72dc2c *)&streamKey;
  streamKey.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  anon_unknown.dwarf_72dc2c::urlkey_from_request(this_02,&message->first);
  stream = QHttp2Connection::promisedStream(*(QHttp2Connection **)(this + 0x38),(QUrl *)this_02);
  if (stream == (QHttp2Stream *)0x0) {
    stream = (QHttp2Stream *)
             QHttp2Connection::createStream
                       (*(QH2Expected<QHttp2Stream_*,_QHttp2Connection::CreateStreamError> **)
                         (this + 0x38),(QHttp2Connection *)this_02);
    iVar6 = (int)stream;
    if (extraout_DL == '\0') {
      if (!uploadDone) {
        pQVar3 = QHttpNetworkRequest::uploadByteDevice(&message->first);
        if (pQVar3 != (QNonContiguousByteDevice *)0x0) {
          copy = (QObject *)_q_uploadDataDestroyed;
          uVar5 = 0;
          local_48 = (ImplFn)0x0;
          local_88.metaType._0_4_ = 0x2e0608;
          local_88.metaType._4_4_ = 0;
          local_88.name._0_4_ = 0;
          local_88.name._4_4_ = 0;
          puVar4 = (undefined4 *)operator_new(0x20);
          *puVar4 = 1;
          *(code **)(puVar4 + 2) =
               QtPrivate::
               QCallableObject<void_(QHttp2ProtocolHandler::*)(QObject_*),_QtPrivate::List<QObject_*>,_void>
               ::impl;
          *(code **)(puVar4 + 4) = _q_uploadDataDestroyed;
          *(undefined8 *)(puVar4 + 6) = 0;
          QObject::connectImpl
                    ((QObject *)&local_b0,(void **)pQVar3,(QObject *)&local_88,(void **)this,
                     (QSlotObjectBase *)&copy,(ConnectionType)puVar4,(int *)0x0,(QMetaObject *)0x0);
          QMetaObject::Connection::~Connection(&local_b0);
          if (stream != (QHttp2Stream *)0x0) {
            uVar5 = QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)stream);
          }
          local_88.metaType._0_4_ = (undefined4)uVar5;
          local_88.metaType._4_4_ = (undefined4)((ulong)uVar5 >> 0x20);
          local_88.name._4_4_ = (undefined4)((ulong)stream >> 0x20);
          local_88.name._0_4_ = iVar6;
          copy = (QObject *)pQVar3;
          QHash<QObject*,QPointer<QHttp2Stream>>::emplace<QPointer<QHttp2Stream>const&>
                    ((QHash<QObject*,QPointer<QHttp2Stream>> *)(this + 0x48),&copy,
                     (QPointer<QHttp2Stream> *)&local_88);
          piVar1 = (int *)CONCAT44(local_88.metaType._4_4_,local_88.metaType._0_4_);
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if ((*piVar1 == 0) &&
               ((void *)CONCAT44(local_88.metaType._4_4_,local_88.metaType._0_4_) != (void *)0x0)) {
              operator_delete((void *)CONCAT44(local_88.metaType._4_4_,local_88.metaType._0_4_));
            }
          }
        }
      }
      copy = (QObject *)QHttpNetworkReply::requestSent;
      local_48 = (ImplFn)0x0;
      local_88.metaType._0_4_ = 0x2cf250;
      local_88.metaType._4_4_ = 0;
      local_88.name._0_4_ = 0;
      local_88.name._4_4_ = 0;
      local_88.data._0_4_ = 0;
      local_88.data._4_4_ = 0;
      QMetaObject::invokeMethodCallableHelper<void(QHttpNetworkReply::*)()>
                (message->second,(offset_in_QHttpNetworkReply_to_subr *)&copy,QueuedConnection,
                 &local_88);
      connectStream(this,message,stream);
    }
    else {
      if (extraout_DL != '\x01') {
        abort();
      }
      if (iVar6 != 0) {
        pQVar2 = QtPrivateLogging::QT_HTTP2();
        if (((pQVar2->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
          local_70 = pQVar2->name;
          local_88.metaType._0_4_ = 2;
          local_88.metaType._4_4_ = 0;
          local_88.name._0_4_ = 0;
          local_88.name._4_4_ = 0;
          local_88.data._0_4_ = 0;
          local_88.data._4_4_ = 0;
          QMessageLogger::debug();
          this_01.stream = local_a0.stream;
          QVar7.m_data = (storage_type *)0x1c;
          QVar7.m_size = (qsizetype)&copy;
          QString::fromUtf8(QVar7);
          QTextStream::operator<<((QTextStream *)this_01.stream,(QString *)&copy);
          if (copy != (QObject *)0x0) {
            LOCK();
            *(int *)copy = *(int *)copy + -1;
            UNLOCK();
            if (*(int *)copy == 0) {
              QArrayData::deallocate((QArrayData *)copy,2,0x10);
            }
          }
          if ((char)(((QArrayData *)(local_a0.stream + 0x30))->ref_)._q_value.
                    super___atomic_base<int>._M_i == '\x01') {
            QTextStream::operator<<((QTextStream *)local_a0.stream,' ');
          }
          local_68.stream = local_a0.stream;
          *(int *)(local_a0.stream + 0x28) = *(int *)(local_a0.stream + 0x28) + 1;
          qt_QMetaEnum_debugOperator
                    (&local_60,(longlong)&local_68,(QMetaObject *)(long)iVar6,
                     (char *)&QHttp2Connection::staticMetaObject);
          QDebug::~QDebug(&local_60);
          QDebug::~QDebug(&local_68);
          QDebug::~QDebug(&local_a0);
        }
        this_00 = message->second;
        local_88.data._0_4_ = 0xaaaaaaaa;
        local_88.data._4_4_ = 0xaaaaaaaa;
        local_88.metaType._0_4_ = 0xaaaaaaaa;
        local_88.metaType._4_4_ = 0xaaaaaaaa;
        local_88.name._0_4_ = 0xaaaaaaaa;
        local_88.name._4_4_ = 0xaaaaaaaa;
        QMetaObject::tr((char *)&copy,(char *)&QCoreApplication::staticMetaObject,0x26b021);
        local_a4 = iVar6;
        QDebug::toStringImpl
                  ((_func_void_QDebug_ptr_void_ptr *)&local_a0,
                   QDebug::streamTypeErased<QHttp2Connection::CreateStreamError>);
        QVar8.m_size = (size_t)&copy;
        QVar8.field_0.m_data = &local_88;
        QString::arg_impl(QVar8,local_98,local_90);
        if ((QArrayData *)local_a0.stream != (QArrayData *)0x0) {
          LOCK();
          *(int *)local_a0.stream = *(int *)local_a0.stream + -1;
          UNLOCK();
          if (*(int *)local_a0.stream == 0) {
            QArrayData::deallocate((QArrayData *)local_a0.stream,2,0x10);
          }
        }
        if (copy != (QObject *)0x0) {
          LOCK();
          *(int *)copy = *(int *)copy + -1;
          UNLOCK();
          if (*(int *)copy == 0) {
            QArrayData::deallocate((QArrayData *)copy,2,0x10);
          }
        }
        QHttpNetworkReply::finishedWithError
                  ((QHttpNetworkReply *)this_00,ProtocolFailure,(QString *)&local_88);
        piVar1 = (int *)CONCAT44(local_88.metaType._4_4_,local_88.metaType._0_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            QArrayData::deallocate
                      ((QArrayData *)CONCAT44(local_88.metaType._4_4_,local_88.metaType._0_4_),2,
                       0x10);
          }
        }
      }
      stream = (QHttp2Stream *)0x0;
    }
  }
  QUrl::~QUrl(&streamKey);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return stream;
  }
  __stack_chk_fail();
}

Assistant:

QHttp2Stream *QHttp2ProtocolHandler::createNewStream(const HttpMessagePair &message,
                                                     bool uploadDone)
{
    QUrl streamKey = urlkey_from_request(message.first);
    if (auto promisedStream = h2Connection->promisedStream(streamKey)) {
        Q_ASSERT(promisedStream->state() != QHttp2Stream::State::Closed);
        return promisedStream;
    }

    QH2Expected<QHttp2Stream *, QHttp2Connection::CreateStreamError>
            streamResult = h2Connection->createStream();
    if (!streamResult.ok()) {
        if (streamResult.error()
            == QHttp2Connection::CreateStreamError::MaxConcurrentStreamsReached) {
            // We have to wait for a stream to be closed before we can create a new one, so
            // we just return nullptr, the caller should not remove it from the queue.
            return nullptr;
        }
        qCDebug(QT_HTTP2) << "failed to create new stream:" << streamResult.error();
        auto *reply = message.second;
        const char *cstr = "Failed to initialize HTTP/2 stream with errorcode: %1";
        const QString errorString = QCoreApplication::tr("QHttp", cstr)
                                            .arg(QDebug::toString(streamResult.error()));
        emit reply->finishedWithError(QNetworkReply::ProtocolFailure, errorString);
        return nullptr;
    }
    QHttp2Stream *stream = streamResult.unwrap();

    if (!uploadDone) {
        if (auto *src = message.first.uploadByteDevice()) {
            connect(src, &QObject::destroyed, this, &QHttp2ProtocolHandler::_q_uploadDataDestroyed);
            streamIDs.insert(src, stream);
        }
    }

    auto *reply = message.second;
    QMetaObject::invokeMethod(reply, &QHttpNetworkReply::requestSent, Qt::QueuedConnection);

    connectStream(message, stream);
    return stream;
}